

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIterator.cpp
# Opt level: O1

void write_itermeta(DatabaseName *target,uint64_t byte_offset,uint64_t file_offset,
                   uint64_t total_files,DatabaseName *backing_storage)

{
  value_t vVar1;
  long lVar2;
  json_value jVar3;
  reference pvVar4;
  ostream *poVar5;
  json iter_json;
  DatabaseName tmp_name;
  ofstream iter_file;
  undefined1 auStack_3b8 [8];
  undefined1 local_3b0 [8];
  json_value local_3a8;
  value_t local_3a0;
  json_value local_398;
  value_t local_390;
  json_value local_388;
  value_t local_380;
  json_value local_378;
  value_t local_370;
  json_value local_368;
  value_t local_360;
  json_value local_358;
  path local_350;
  DatabaseName local_310;
  path local_270;
  long local_230;
  filebuf local_228 [8];
  undefined8 uStack_220;
  undefined4 auStack_214 [55];
  ios_base local_138 [264];
  
  DatabaseName::derive_temporary(&local_310,target);
  std::ofstream::ofstream(&local_230);
  lVar2 = *(long *)(local_230 + -0x18);
  *(undefined4 *)((long)auStack_214 + lVar2) = 1;
  std::ios::clear((int)auStack_3b8 + (int)lVar2 + 0x188);
  DatabaseName::get_full_path_abi_cxx11_(&local_350,&local_310);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)local_350._M_pathname._M_dataplus._M_p);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_350);
  local_3b0[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  )0x0;
  local_3a8.object = (object_t *)0x0;
  local_360 = number_unsigned;
  local_358 = (json_value)byte_offset;
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_3b0,"byte_offset");
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_360;
  jVar3 = pvVar4->m_value;
  (pvVar4->m_value).number_unsigned = (number_unsigned_t)local_358;
  local_360 = vVar1;
  local_358 = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_358.boolean,vVar1);
  local_370 = number_unsigned;
  local_368 = (json_value)file_offset;
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_3b0,"file_offset");
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_370;
  jVar3 = pvVar4->m_value;
  (pvVar4->m_value).number_unsigned = (number_unsigned_t)local_368;
  local_370 = vVar1;
  local_368 = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_368.boolean,vVar1);
  local_380 = number_unsigned;
  local_378 = (json_value)total_files;
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_3b0,"total_files");
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_380;
  jVar3 = pvVar4->m_value;
  (pvVar4->m_value).number_unsigned = (number_unsigned_t)local_378;
  local_380 = vVar1;
  local_378 = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_378.boolean,vVar1);
  local_398.object = (object_t *)0x0;
  local_3a0 = string;
  local_398.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,std::__cxx11::string_const&>(&backing_storage->filename);
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_3b0,"backing_storage");
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_3a0;
  jVar3 = pvVar4->m_value;
  (pvVar4->m_value).object = (object_t *)local_398;
  local_3a0 = vVar1;
  local_398 = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_398.boolean,vVar1);
  local_388.number_integer = time((time_t *)0x0);
  local_390 = number_integer;
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_3b0,"last_read_timestamp");
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_390;
  jVar3 = pvVar4->m_value;
  (pvVar4->m_value).number_integer = (number_integer_t)local_388;
  local_390 = vVar1;
  local_388 = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_388.boolean,vVar1);
  *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 4;
  poVar5 = nlohmann::operator<<
                     ((ostream *)&local_230,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_3b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::ofstream::close();
  DatabaseName::get_full_path_abi_cxx11_(&local_350,&local_310);
  DatabaseName::get_full_path_abi_cxx11_(&local_270,target);
  std::experimental::filesystem::v1::rename(&local_350,&local_270);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_270);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_350);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_3b0 + 8),(value_t)local_3b0[0]);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _seekpos;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.filename._M_dataplus._M_p != &local_310.filename.field_2) {
    operator_delete(local_310.filename._M_dataplus._M_p,
                    local_310.filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.id._M_dataplus._M_p != &local_310.id.field_2) {
    operator_delete(local_310.id._M_dataplus._M_p,local_310.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.type._M_dataplus._M_p != &local_310.type.field_2) {
    operator_delete(local_310.type._M_dataplus._M_p,local_310.type.field_2._M_allocated_capacity + 1
                   );
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_310.db_base);
  return;
}

Assistant:

void write_itermeta(const DatabaseName &target, uint64_t byte_offset,
                    uint64_t file_offset, uint64_t total_files,
                    const DatabaseName &backing_storage) {
    DatabaseName tmp_name = target.derive_temporary();
    std::ofstream iter_file;
    iter_file.exceptions(std::ofstream::badbit);
    iter_file.open(tmp_name.get_full_path(), std::ofstream::binary);

    json iter_json;
    iter_json["byte_offset"] = byte_offset;
    iter_json["file_offset"] = file_offset;
    iter_json["total_files"] = total_files;
    iter_json["backing_storage"] = backing_storage.get_filename();
    iter_json["last_read_timestamp"] = std::time(nullptr);

    iter_file << std::setw(4) << iter_json << std::endl;
    iter_file.close();

    fs::rename(tmp_name.get_full_path(), target.get_full_path());
}